

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output_xml_repeat_tests.cpp
# Opt level: O3

void __thiscall
iu_TestF_x_iutest_x_XmlFilePath_Test::Body(iu_TestF_x_iutest_x_XmlFilePath_Test *this)

{
  Variable *pVVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertionResult iutest_ar;
  char expect [256];
  allocator<char> local_2f9;
  AssertionResult local_2f8;
  AssertionHelper local_2d0;
  undefined1 local_2a0 [392];
  char local_118 [264];
  
  iutest::detail::iu_snprintf(local_118,0x100,"test_%d.xml",(ulong)(uint)TestF::nI);
  pVVar1 = iutest::TestEnv::get_vars();
  iutest::internal::CmpHelperEQ<char[256],std::__cxx11::string>
            (&local_2f8,(internal *)"expect",
             "(reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath())"
             ,local_118,(char (*) [256])((pVVar1->m_event_listeners).m_default_xml_generator + 5),
             in_R9);
  if (local_2f8.m_result == false) {
    memset((iu_global_format_stringstream *)local_2a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_2a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2d0,local_2f8.m_message._M_dataplus._M_p,&local_2f9);
    local_2d0.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/output_xml_repeat_tests.cpp"
    ;
    local_2d0.m_part_result.super_iuCodeMessage.m_line = 0x30;
    local_2d0.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_2d0,(Fixed *)local_2a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p !=
        &local_2d0.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete(local_2d0.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      local_2d0.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_2a0);
    std::ios_base::~ios_base((ios_base *)(local_2a0 + 0x80));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2f8.m_message._M_dataplus._M_p != &local_2f8.m_message.field_2) {
    operator_delete(local_2f8.m_message._M_dataplus._M_p,
                    local_2f8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST_F(TestF, XmlFilePath)
{
    char expect[256];
    ::iutest::detail::iu_snprintf(expect, sizeof(expect), "test_%d.xml", nI);
    IUTEST_ASSERT_EQ( expect
        , (reinterpret_cast< ::iutest::DefaultXmlGeneratorListener*>(::iutest::TestEnv::event_listeners().default_xml_generator())->GetFilePath()) );
}